

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O0

quad_value_bit_vector *
bsim::quad_value_bit_vector_operations::lor(quad_value_bit_vector *a,quad_value_bit_vector *b)

{
  quad_value qVar1;
  int iVar2;
  quad_value_bit_vector *in_RSI;
  quad_value_bit_vector *in_RDI;
  int i;
  quad_value_bit_vector *a_or_b;
  undefined4 in_stack_ffffffffffffffa8;
  int iVar3;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar4;
  uint3 in_stack_ffffffffffffffe4;
  uint uVar5;
  
  uVar5 = (uint)in_stack_ffffffffffffffe4;
  quad_value_bit_vector::bitLength(in_RSI);
  quad_value_bit_vector::quad_value_bit_vector
            ((quad_value_bit_vector *)CONCAT44(uVar5,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffdc);
  iVar4 = 0;
  while (iVar3 = iVar4, iVar2 = quad_value_bit_vector::bitLength(in_RSI), iVar4 < iVar2) {
    iVar2 = iVar3;
    quad_value_bit_vector::get((quad_value_bit_vector *)CONCAT44(iVar3,in_stack_ffffffffffffffa8),0)
    ;
    quad_value_bit_vector::get((quad_value_bit_vector *)CONCAT44(iVar3,in_stack_ffffffffffffffa8),0)
    ;
    qVar1 = operator|((quad_value *)in_RDI,(quad_value *)CONCAT44(iVar4,in_stack_ffffffffffffffb0));
    in_stack_ffffffffffffffb0 = CONCAT13(qVar1.value,(int3)in_stack_ffffffffffffffb0);
    quad_value_bit_vector::set
              ((quad_value_bit_vector *)CONCAT44(iVar3,in_stack_ffffffffffffffa8),0,
               (quad_value)(uchar)((uint)iVar4 >> 0x18));
    iVar4 = iVar2 + 1;
  }
  return in_RDI;
}

Assistant:

static inline quad_value_bit_vector lor(const quad_value_bit_vector& a,
					 const quad_value_bit_vector& b) {
      quad_value_bit_vector a_or_b(a.bitLength());
      for (int i = 0; i < a.bitLength(); i++) {
  	a_or_b.set(i, a.get(i) | b.get(i));
      }
      return a_or_b;
    }